

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

int64 __thiscall TTD::EventLog::GetFirstEventTimeInLog(EventLog *this)

{
  int64 iVar1;
  bool bVar2;
  undefined1 local_38 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_38,&this->m_eventList);
  bVar2 = local_38 == (undefined1  [8])0x0;
  if (!bVar2) {
    do {
      if (iter.m_currLink < *(TTEventListLink **)((long)local_38 + 8)) {
        return -1;
      }
      if ((TTEventListLink *)*(size_t *)local_38 <= iter.m_currLink) {
        return -1;
      }
      if (((bVar2) || (iter.m_currLink < *(TTEventListLink **)((long)local_38 + 8))) ||
         ((TTEventListLink *)*(size_t *)local_38 <= iter.m_currLink)) {
LAB_008e2f8c:
        TTDAbort_unrecoverable_error("Iterator is invalid!!!");
      }
      bVar2 = NSLogEvents::IsJsRTActionRootCall
                        ((EventLogEntry *)
                         (*(byte **)((long)local_38 + 0x10) + (long)&(iter.m_currLink)->CurrPos));
      if (bVar2) {
        if (((local_38 != (undefined1  [8])0x0) &&
            (*(TTEventListLink **)((long)local_38 + 8) <= iter.m_currLink)) &&
           (iter.m_currLink < (TTEventListLink *)*(size_t *)local_38)) {
          iVar1 = NSLogEvents::GetTimeFromRootCallOrSnapshot
                            ((EventLogEntry *)
                             (*(byte **)((long)local_38 + 0x10) + (long)&(iter.m_currLink)->CurrPos)
                            );
          return iVar1;
        }
        goto LAB_008e2f8c;
      }
      TTEventList::Iterator::MoveNext((Iterator *)local_38);
      bVar2 = local_38 == (undefined1  [8])0x0;
    } while (!bVar2);
  }
  return -1;
}

Assistant:

int64 EventLog::GetFirstEventTimeInLog() const
    {
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
            }
        }

        return -1;
    }